

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integer.c
# Opt level: O0

sysbvm_tuple_t sysbvm_tuple_integer_encodeBigUInt32(sysbvm_context_t *context,uint32_t value)

{
  sysbvm_integer_t *result;
  uint32_t value_local;
  sysbvm_context_t *context_local;
  
  if ((ulong)value < 0x800000000000000) {
    context_local = (sysbvm_context_t *)sysbvm_tuple_integer_encodeSmall((ulong)value);
  }
  else {
    context_local =
         (sysbvm_context_t *)
         sysbvm_context_allocateByteTuple(context,(context->roots).largePositiveIntegerType,4);
    *(uint32_t *)&(context_local->heap).shouldAttemptToCollect = value;
  }
  return (sysbvm_tuple_t)context_local;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_tuple_integer_encodeBigUInt32(sysbvm_context_t *context, uint32_t value)
{
#ifdef __GNUC__
#pragma GCC diagnostic push
#pragma GCC diagnostic ignored "-Wtype-limits"
#endif
    if(value <= SYSBVM_IMMEDIATE_INT_MAX)
        return sysbvm_tuple_integer_encodeSmall(value);

#ifdef __GNUC__
#pragma GCC diagnostic pop
#endif

    sysbvm_integer_t *result = (sysbvm_integer_t*)sysbvm_context_allocateByteTuple(context, context->roots.largePositiveIntegerType, 4);
    result->words[0] = (uint32_t)value;
    return (sysbvm_tuple_t)result;
}